

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O0

int xmlThrDefSubstituteEntitiesDefaultValue(int v)

{
  int iVar1;
  int ret;
  int v_local;
  
  xmlMutexLock(&xmlThrDefMutex);
  iVar1 = xmlSubstituteEntitiesDefaultValueThrDef;
  xmlSubstituteEntitiesDefaultValueThrDef = v;
  xmlMutexUnlock(&xmlThrDefMutex);
  return iVar1;
}

Assistant:

int xmlThrDefSubstituteEntitiesDefaultValue(int v) {
    int ret;
    xmlMutexLock(&xmlThrDefMutex);
    ret = xmlSubstituteEntitiesDefaultValueThrDef;
    xmlSubstituteEntitiesDefaultValueThrDef = v;
    xmlMutexUnlock(&xmlThrDefMutex);
    return ret;
}